

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O1

matrix<long,_0L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout> *
__thiscall
dlib::matrix<long,0l,1l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>::
operator=(matrix<long,0l,1l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>
          *this,matrix_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_range_exp<long>_>_>_> *m)

{
  size_t *psVar1;
  size_t nr;
  long lVar2;
  long *plVar3;
  long lVar4;
  
  psVar1 = *(size_t **)m;
  nr = *psVar1;
  if (*(size_t *)(this + 8) == nr) {
    if (0 < (long)nr) {
      lVar2 = *(long *)this;
      lVar4 = 0;
      do {
        *(size_t *)(lVar2 + lVar4 * 8) = psVar1[2] * lVar4 + psVar1[1];
        lVar4 = lVar4 + 1;
      } while (lVar4 < (long)*psVar1);
    }
  }
  else {
    row_major_layout::layout<long,_0L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_3>::
    set_size((layout<long,_0L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_3> *)this,nr,1);
    plVar3 = *(long **)m;
    if (0 < *plVar3) {
      lVar2 = *(long *)this;
      lVar4 = 0;
      do {
        *(long *)(lVar2 + lVar4 * 8) = plVar3[2] * lVar4 + plVar3[1];
        lVar4 = lVar4 + 1;
      } while (lVar4 < *plVar3);
    }
  }
  return (matrix<long,_0L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
          *)this;
}

Assistant:

matrix& operator= (
            const matrix_exp<EXP>& m
        )
        {
            // You get an error on this line if the matrix you are trying to 
            // assign m to is a statically sized matrix and  m's dimensions don't 
            // match that of *this. 
            COMPILE_TIME_ASSERT(EXP::NR == NR || NR == 0 || EXP::NR == 0);
            COMPILE_TIME_ASSERT(EXP::NC == NC || NC == 0 || EXP::NC == 0);
            DLIB_ASSERT((NR == 0 || nr() == m.nr()) && 
                   (NC == 0 || nc() == m.nc()), 
                "\tmatrix& matrix::operator=(const matrix_exp& m)"
                << "\n\tYou are trying to assign a dynamically sized matrix to a statically sized matrix with the wrong size"
                << "\n\tnr():   " << nr()
                << "\n\tnc():   " << nc()
                << "\n\tm.nr(): " << m.nr()
                << "\n\tm.nc(): " << m.nc()
                << "\n\tthis:   " << this
                );

            // You get an error on this line if the matrix m contains a type that isn't
            // the same as the type contained in the target matrix.
            COMPILE_TIME_ASSERT((is_same_type<typename EXP::type,type>::value == true) ||
                                (is_matrix<typename EXP::type>::value == true));
            if (m.destructively_aliases(*this) == false)
            {
                // This if statement is seemingly unnecessary since set_size() contains this
                // exact same if statement.  However, structuring the code this way causes
                // gcc to handle the way it inlines this function in a much more favorable way.
                if (data.nr() == m.nr() && data.nc() == m.nc())
                {
                    matrix_assign(*this, m);
                }
                else
                {
                    set_size(m.nr(),m.nc());
                    matrix_assign(*this, m);
                }
            }
            else
            {
                // we have to use a temporary matrix object here because
                // *this is aliased inside the matrix_exp m somewhere.
                matrix temp;
                temp.set_size(m.nr(),m.nc());
                matrix_assign(temp, m);
                temp.swap(*this);
            }
            return *this;
        }